

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O1

Gia_Man_t * Gia_ManStgKHot(Vec_Int_t *vLines,int nIns,int nOuts,int nStates,int kHot,int fVerbose)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  void *pvVar3;
  Vec_Vec_t *__ptr;
  Vec_Vec_t *pVVar4;
  Vec_Int_t *__ptr_00;
  uint uVar5;
  Vec_Vec_t *pVVar6;
  Gia_Man_t *p;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  int *piVar9;
  Vec_Int_t *p_00;
  void **ppvVar10;
  undefined8 *puVar11;
  Gia_Man_t *p_01;
  int iVar12;
  undefined4 in_register_00000014;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  char *__file;
  char *__assertion;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  int nBits;
  uint local_a0;
  uint local_7c;
  ulong local_78;
  Vec_Vec_t *local_70;
  Vec_Vec_t *local_68;
  Vec_Int_t *local_60;
  ulong local_58;
  int local_4c;
  Vec_Int_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_00000014,nOuts);
  local_48 = vLines;
  if ((vLines->nSize & 3) != 0) {
    __assert_fail("Vec_IntSize(vLines) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                  ,0xdd,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
  }
  pVVar6 = Gia_ManAssignCodes(kHot,nStates,(int *)&local_7c);
  uVar5 = pVVar6->nSize;
  if (uVar5 != nStates) {
    __assert_fail("Vec_VecSize(vCodes) == nStates",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                  ,0xe1,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
  }
  local_78 = (ulong)(uint)nStates;
  if (fVerbose != 0) {
    Gia_ManPrintStateEncoding(pVVar6,local_7c);
  }
  local_70 = pVVar6;
  p = Gia_ManStart(10000);
  pcVar7 = (char *)malloc(4);
  builtin_strncpy(pcVar7,"stg",4);
  p->pName = pcVar7;
  local_58 = (ulong)local_7c;
  iVar13 = local_7c + nIns;
  if (iVar13 != 0 && SCARRY4(local_7c,nIns) == iVar13 < 0) {
    do {
      pGVar8 = Gia_ManAppendObj(p);
      uVar18 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p->pObjs;
      if ((pGVar8 < pGVar2) || (pGVar2 + p->nObjs <= pGVar8)) {
LAB_0071e845:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555);
      if ((pGVar8 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar8)) goto LAB_0071e845;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  Gia_ManHashAlloc(p);
  uVar14 = 1 << ((byte)nIns & 0x1f);
  local_60 = (Vec_Int_t *)malloc(0x10);
  uVar17 = 0x10;
  if (0x10 < uVar14) {
    uVar17 = uVar14;
  }
  local_60->nSize = 0;
  local_60->nCap = uVar17;
  piVar9 = (int *)malloc((long)(int)uVar17 << 2);
  local_60->pArray = piVar9;
  if (nIns != 0x1f) {
    local_a0 = 1;
    if (1 < (int)uVar14) {
      local_a0 = uVar14;
    }
    uVar17 = 0;
    do {
      if (nIns < 1) {
        iVar13 = 1;
      }
      else {
        iVar13 = 1;
        iVar15 = 2;
        uVar22 = 0;
        do {
          uVar21 = uVar22 + 1;
          iVar13 = Gia_ManHashAnd(p,iVar13,iVar15 + (uint)((~uVar17 >> (uVar22 & 0x1f) & 1) != 0));
          iVar15 = iVar15 + 2;
          uVar22 = uVar21;
        } while (nIns != uVar21);
      }
      Vec_IntPush(local_60,iVar13);
      uVar17 = uVar17 + 1;
    } while (uVar17 != local_a0);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < (int)local_78 - 1U) {
    iVar13 = (int)local_78;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar13;
  if (iVar13 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar13 << 2);
  }
  p_00->pArray = piVar9;
  if (0 < (int)uVar5) {
    ppvVar10 = local_70->pArray;
    uVar18 = 0;
    do {
      pvVar3 = ppvVar10[uVar18];
      if (*(int *)((long)pvVar3 + 4) < 1) {
        iVar13 = 1;
      }
      else {
        iVar13 = 1;
        lVar16 = 0;
        do {
          iVar15 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar16 * 4);
          if ((iVar15 < 0) || ((int)local_58 <= iVar15)) {
            __assert_fail("b >= 0 && b < nBits",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                          ,0xfc,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
          }
          iVar12 = nIns + 1 + iVar15;
          if (iVar12 < 0) {
            __assertion = "Var >= 0 && !(c >> 1)";
            __file = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
            ;
            pcVar7 = "int Abc_Var2Lit(int, int)";
            goto LAB_0071e7fd;
          }
          iVar13 = Gia_ManHashAnd(p,iVar13,(uint)(iVar15 < kHot) + iVar12 * 2);
          lVar16 = lVar16 + 1;
        } while (lVar16 < *(int *)((long)pvVar3 + 4));
      }
      Vec_IntPush(p_00,iVar13);
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar5);
  }
  local_68 = (Vec_Vec_t *)malloc(0x10);
  uVar18 = local_58;
  iVar13 = (int)local_58;
  iVar15 = 8;
  if (6 < iVar13 - 1U) {
    iVar15 = iVar13;
  }
  local_68->nSize = 0;
  local_68->nCap = iVar15;
  if (iVar15 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)iVar15 << 3);
  }
  uVar19 = local_78;
  local_68->pArray = ppvVar10;
  if (0 < iVar13) {
    uVar23 = 0;
    do {
      puVar11 = (undefined8 *)malloc(0x10);
      *puVar11 = 0;
      puVar11[1] = 0;
      ppvVar10[uVar23] = puVar11;
      uVar23 = uVar23 + 1;
    } while (uVar18 != uVar23);
  }
  local_68->nSize = iVar13;
  pVVar6 = (Vec_Vec_t *)malloc(0x10);
  uVar18 = local_40;
  iVar13 = (int)local_40;
  iVar15 = 8;
  if (6 < iVar13 - 1U) {
    iVar15 = iVar13;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar15;
  if (iVar15 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)iVar15 << 3);
  }
  pVVar6->pArray = ppvVar10;
  if (0 < iVar13) {
    uVar23 = 0;
    do {
      puVar11 = (undefined8 *)malloc(0x10);
      *puVar11 = 0;
      puVar11[1] = 0;
      ppvVar10[uVar23] = puVar11;
      uVar23 = uVar23 + 1;
    } while ((uVar18 & 0xffffffff) != uVar23);
  }
  pVVar6->nSize = iVar13;
  iVar13 = local_48->nSize;
  if (0 < iVar13) {
    local_4c = 1 << ((byte)uVar18 & 0x1f);
    uVar18 = 0;
    do {
      lVar16 = (long)iVar13;
      if (((lVar16 <= (long)(uVar18 | 1)) || (lVar16 <= (long)(uVar18 | 2))) ||
         (lVar16 <= (long)(uVar18 | 3))) {
LAB_0071e826:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar9 = local_48->pArray;
      uVar17 = piVar9[uVar18];
      if (((int)uVar17 < 0) || ((int)uVar14 <= (int)uVar17)) {
        __assertion = "iMint >= 0 && iMint < (1<<nIns)";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
        ;
        pcVar7 = "Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)";
LAB_0071e7fd:
        __assert_fail(__assertion,__file,0x10b,pcVar7);
      }
      uVar22 = piVar9[uVar18 | 1];
      if (((int)uVar22 < 0) || ((int)uVar19 <= (int)uVar22)) {
        __assert_fail("iCur >= 0 && iCur < nStates",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                      ,0x10c,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
      }
      uVar21 = piVar9[uVar18 | 2];
      if (((int)uVar21 < 0) || ((int)uVar19 <= (int)uVar21)) {
        __assert_fail("iNext >= 0 && iNext < nStates",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                      ,0x10d,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
      }
      uVar1 = piVar9[uVar18 | 3];
      if (((int)uVar1 < 0) || (local_4c <= (int)uVar1)) {
        __assert_fail("iOut >= 0 && iOut < (1<<nOuts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                      ,0x10e,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
      }
      if ((local_60->nSize <= (int)uVar17) || (p_00->nSize <= (int)uVar22)) goto LAB_0071e826;
      iVar13 = Gia_ManHashAnd(p,local_60->pArray[uVar17],p_00->pArray[uVar22]);
      pVVar4 = local_68;
      if ((int)uVar5 <= (int)uVar21) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      pvVar3 = local_70->pArray[uVar21];
      local_38 = uVar18;
      if (0 < *(int *)((long)pvVar3 + 4)) {
        lVar16 = 0;
        do {
          Vec_VecPushInt(pVVar4,*(int *)(*(long *)((long)pvVar3 + 8) + lVar16 * 4),iVar13);
          lVar16 = lVar16 + 1;
        } while (lVar16 < *(int *)((long)pvVar3 + 4));
      }
      uVar17 = (uint)local_40;
      if (0 < (int)uVar17) {
        uVar22 = 0;
        do {
          if ((uVar1 >> (uVar22 & 0x1f) & 1) != 0) {
            Vec_VecPushInt(pVVar6,uVar22,iVar13);
          }
          uVar22 = uVar22 + 1;
        } while (uVar17 != uVar22);
      }
      uVar18 = local_38 + 4;
      iVar13 = local_48->nSize;
      uVar19 = local_78;
    } while ((int)uVar18 < iVar13);
  }
  __ptr_00 = local_60;
  if (local_60->pArray != (int *)0x0) {
    free(local_60->pArray);
    __ptr_00->pArray = (int *)0x0;
  }
  free(__ptr_00);
  pVVar4 = local_68;
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (0 < (int)uVar5) {
    ppvVar10 = local_70->pArray;
    uVar18 = 0;
    do {
      pvVar3 = ppvVar10[uVar18];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      uVar18 = uVar18 + 1;
    } while (uVar5 != uVar18);
  }
  __ptr = local_70;
  if (local_70->pArray != (void **)0x0) {
    free(local_70->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Vec_t *)0x0) {
    free(__ptr);
  }
  iVar13 = pVVar6->nSize;
  lVar16 = (long)iVar13;
  if (0 < lVar16) {
    ppvVar10 = pVVar6->pArray;
    lVar20 = 0;
    do {
      iVar15 = Gia_ManCreateOrGate(p,(Vec_Int_t *)ppvVar10[lVar20]);
      Gia_ManAppendCo(p,iVar15);
      lVar20 = lVar20 + 1;
    } while (lVar16 != lVar20);
  }
  if (0 < iVar13) {
    ppvVar10 = pVVar6->pArray;
    lVar20 = 0;
    do {
      pvVar3 = ppvVar10[lVar20];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      lVar20 = lVar20 + 1;
    } while (lVar16 != lVar20);
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  free(pVVar6);
  iVar13 = pVVar4->nSize;
  lVar16 = (long)iVar13;
  if (0 < lVar16) {
    ppvVar10 = pVVar4->pArray;
    lVar20 = 0;
    do {
      uVar5 = Gia_ManCreateOrGate(p,(Vec_Int_t *)ppvVar10[lVar20]);
      if ((int)uVar5 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p,uVar5 ^ lVar20 < kHot);
      lVar20 = lVar20 + 1;
    } while (lVar16 != lVar20);
  }
  if (0 < iVar13) {
    ppvVar10 = pVVar4->pArray;
    lVar20 = 0;
    do {
      pvVar3 = ppvVar10[lVar20];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      lVar20 = lVar20 + 1;
    } while (lVar16 != lVar20);
  }
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  free(pVVar4);
  Gia_ManSetRegNum(p,(int)local_58);
  Gia_ManHashStop(p);
  p_01 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  iVar13 = Gia_ManHasDangling(p_01);
  if (iVar13 != 0) {
    __assert_fail("!Gia_ManHasDangling(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                  ,0x12e,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
  }
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManStgKHot( Vec_Int_t * vLines, int nIns, int nOuts, int nStates, int kHot, int fVerbose )
{
    Gia_Man_t * p, * pTemp;
    Vec_Int_t * vInMints, * vCurs, * vVec;
    Vec_Vec_t * vLitsNext, * vLitsOuts, * vCodes;
    int i, b, k, nBits, LitC, Lit;
    assert( Vec_IntSize(vLines) % 4 == 0 );

    // produce state encoding
    vCodes = Gia_ManAssignCodes( kHot, nStates, &nBits );
    assert( Vec_VecSize(vCodes) == nStates );
    if ( fVerbose )
        Gia_ManPrintStateEncoding( vCodes, nBits );

    // start manager
    p = Gia_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( "stg" );
    for ( i = 0; i < nIns + nBits; i++ )
        Gia_ManAppendCi(p);

    // create input minterms
    Gia_ManHashAlloc( p );
    vInMints = Vec_IntAlloc( 1 << nIns );
    for ( i = 0; i < (1 << nIns); i++ )
    {
        for ( Lit = 1, b = 0; b < nIns; b++ )
            Lit = Gia_ManHashAnd( p, Lit, Abc_Var2Lit( b+1, !((i >> b) & 1) ) );
        Vec_IntPush( vInMints, Lit );
    } 

    // create current states
    vCurs  = Vec_IntAlloc( nStates );
    Vec_VecForEachLevelInt( vCodes, vVec, i )
    {
        Lit = 1;
        Vec_IntForEachEntry( vVec, b, k )
        {
            assert( b >= 0 && b < nBits );
            Lit = Gia_ManHashAnd( p, Lit, Abc_Var2Lit(1+nIns+b, (b<kHot)) );
        }
        Vec_IntPush( vCurs, Lit );
    }

    // go through the lines
    vLitsNext = Vec_VecStart( nBits );
    vLitsOuts = Vec_VecStart( nOuts );
    for ( i = 0; i < Vec_IntSize(vLines); )
    {
        int iMint = Vec_IntEntry(vLines, i++);
        int iCur  = Vec_IntEntry(vLines, i++);
        int iNext = Vec_IntEntry(vLines, i++);
        int iOut  = Vec_IntEntry(vLines, i++);
        assert( iMint >= 0 && iMint < (1<<nIns)  );
        assert( iCur  >= 0 && iCur  < nStates    );
        assert( iNext >= 0 && iNext < nStates    );
        assert( iOut  >= 0 && iOut  < (1<<nOuts) );
        // create condition
        LitC = Gia_ManHashAnd( p, Vec_IntEntry(vInMints, iMint), Vec_IntEntry(vCurs, iCur) );
        // update next state
//        Vec_VecPushInt( vLitsNext, iNext, LitC );
        vVec = (Vec_Int_t *)Vec_VecEntryInt( vCodes, iNext );
        Vec_IntForEachEntry( vVec, b, k )
            Vec_VecPushInt( vLitsNext, b, LitC );
        // update outputs
        for ( b = 0; b < nOuts; b++ )
            if ( (iOut >> b) & 1 ) 
                Vec_VecPushInt( vLitsOuts, b, LitC );
    }
    Vec_IntFree( vInMints );
    Vec_IntFree( vCurs );
    Vec_VecFree( vCodes );

    // create POs
    Vec_VecForEachLevelInt( vLitsOuts, vVec, b )
        Gia_ManAppendCo( p, Gia_ManCreateOrGate(p, vVec) );
    Vec_VecFree( vLitsOuts );

    // create next states
    Vec_VecForEachLevelInt( vLitsNext, vVec, b )
        Gia_ManAppendCo( p, Abc_LitNotCond( Gia_ManCreateOrGate(p, vVec), (b<kHot) ) );
    Vec_VecFree( vLitsNext );

    Gia_ManSetRegNum( p, nBits );
    Gia_ManHashStop( p );

    p = Gia_ManCleanup( pTemp = p );
    Gia_ManStop( pTemp );
    assert( !Gia_ManHasDangling(p) );
    return p;
}